

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

TRef lj_opt_narrow_tobit(jit_State *J,TRef tr)

{
  TRef TVar1;
  cTValue *tv;
  ulong uVar2;
  
  uVar2 = (ulong)tr;
  if ((tr & 0x1f000000) == 0x4000000) {
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x588e0000;
    TVar1 = lj_opt_fold(J);
    uVar2 = (ulong)TVar1;
  }
  if (((uint)uVar2 & 0x1f000000) == 0xe000000) {
    tv = lj_ir_k64_find(J,0x4338000000000000);
    TVar1 = lj_ir_k64(J,IR_KNUM,tv);
    (J->fold).ins.field_0.ot = 0x5613;
    (J->fold).ins.field_0.op1 = (IRRef1)uVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar1 = lj_opt_fold(J);
    return TVar1;
  }
  if (((uint)(uVar2 >> 0x18) & 0x1f) - 0xf < 5) {
    TVar1 = narrow_stripov(J,(uint)uVar2,0x36,0x273);
    return TVar1;
  }
  lj_trace_err(J,LJ_TRERR_BADTYPE);
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_tobit(jit_State *J, TRef tr)
{
  if (tref_isstr(tr))
    tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
  if (tref_isnum(tr))  /* Conversion may be narrowed, too. See above. */
    return emitir(IRTI(IR_TOBIT), tr, lj_ir_knum_tobit(J));
  if (!tref_isinteger(tr))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  /*
  ** Wrapped overflow semantics allow stripping of ADDOV and SUBOV.
  ** MULOV cannot be stripped due to precision widening.
  */
  return narrow_stripov(J, tr, IR_SUBOV, (IRT_INT<<5)|IRT_INT|IRCONV_TOBIT);
}